

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasindex.cpp
# Opt level: O2

BOOL __thiscall LASindex::intersect_circle(LASindex *this,F64 center_x,F64 center_y,F64 radius)

{
  BOOL BVar1;
  U32 UVar2;
  
  this->have_interval = false;
  UVar2 = LASquadtree::intersect_circle(this->spatial,center_x,center_y,radius);
  this->cells = UVar2;
  if (UVar2 != 0) {
    BVar1 = merge_intervals(this);
    return BVar1;
  }
  return false;
}

Assistant:

BOOL LASindex::intersect_circle(const F64 center_x, const F64 center_y, const F64 radius)
{
  have_interval = FALSE;
  cells = spatial->intersect_circle(center_x, center_y, radius);
//  LASMessage(LAS_VERBOSE, "%d cells of %g/%g %g/%g intersect circle %g/%g/%g", num_cells, spatial->get_min_x(), spatial->get_min_y(), spatial->get_max_x(), spatial->get_max_y(), center_x, center_y, radius);
  if (cells)
    return merge_intervals();
  return FALSE;
}